

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O2

void __thiscall
t_rs_generator::render_sync_client_tthriftclient_impl(t_rs_generator *this,string *client_impl_name)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  ostream *poVar3;
  string local_40;
  
  poVar1 = &this->f_gen_;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,"impl ");
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," TThriftClient for ");
  poVar3 = std::operator<<(poVar3,(string *)client_impl_name);
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUND_VARS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," ");
  poVar3 = std::operator<<(poVar3,(string *)&SYNC_CLIENT_GENERIC_BOUNDS_abi_cxx11_);
  poVar3 = std::operator<<(poVar3," {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,
                           "fn i_prot_mut(&mut self) -> &mut dyn TInputProtocol { &mut self._i_prot }"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,
                           "fn o_prot_mut(&mut self) -> &mut dyn TOutputProtocol { &mut self._o_prot }"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,"fn sequence_number(&self) -> i32 { self._sequence_number }");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,
                           "fn increment_sequence_number(&mut self) -> i32 { self._sequence_number += 1; self._sequence_number }"
                          );
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  piVar2 = &(this->super_t_generator).indent_;
  *piVar2 = *piVar2 + -1;
  t_generator::indent_abi_cxx11_(&local_40,&this->super_t_generator);
  poVar3 = std::operator<<((ostream *)poVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  std::operator<<((ostream *)poVar1,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rs_generator::render_sync_client_tthriftclient_impl(const string &client_impl_name) {
  f_gen_
    << indent()
    << "impl "
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " TThriftClient for "
    << client_impl_name
    << SYNC_CLIENT_GENERIC_BOUND_VARS
    << " "
    << SYNC_CLIENT_GENERIC_BOUNDS
    << " {" << endl;
  indent_up();

  f_gen_ << indent() << "fn i_prot_mut(&mut self) -> &mut dyn TInputProtocol { &mut self._i_prot }" << endl;
  f_gen_ << indent() << "fn o_prot_mut(&mut self) -> &mut dyn TOutputProtocol { &mut self._o_prot }" << endl;
  f_gen_ << indent() << "fn sequence_number(&self) -> i32 { self._sequence_number }" << endl;
  f_gen_
    << indent()
    << "fn increment_sequence_number(&mut self) -> i32 { self._sequence_number += 1; self._sequence_number }"
    << endl;

  indent_down();
  f_gen_ << indent() << "}" << endl;
  f_gen_ << endl;
}